

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O2

bool __thiscall
ViconCGStreamIO::VBuffer::Read<ViconCGStreamDetail::VLightweightSegments_Segment>
          (VBuffer *this,
          vector<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
          *o_rValues)

{
  pointer pVVar1;
  bool bVar2;
  uint in_EAX;
  VLightweightSegments_Segment *o_pValues;
  UInt32 Size;
  undefined8 uStack_18;
  
  pVVar1 = (o_rValues->
           super__Vector_base<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((o_rValues->
      super__Vector_base<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
      )._M_impl.super__Vector_impl_data._M_finish != pVVar1) {
    (o_rValues->
    super__Vector_base<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
    )._M_impl.super__Vector_impl_data._M_finish = pVVar1;
  }
  uStack_18 = (ulong)in_EAX;
  bVar2 = VBufferImpl::ReadPod<unsigned_int>(&this->m_BufferImpl,(uint *)((long)&uStack_18 + 4));
  if (bVar2) {
    std::
    vector<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
    ::resize(o_rValues,uStack_18 >> 0x20);
    pVVar1 = (o_rValues->
             super__Vector_base<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
             )._M_impl.super__Vector_impl_data._M_start;
    o_pValues = (VLightweightSegments_Segment *)0x0;
    if (pVVar1 != (o_rValues->
                  super__Vector_base<ViconCGStreamDetail::VLightweightSegments_Segment,_std::allocator<ViconCGStreamDetail::VLightweightSegments_Segment>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      o_pValues = pVVar1;
    }
    bVar2 = VBufferDetail<0>::Read<ViconCGStreamDetail::VLightweightSegments_Segment>
                      (&this->m_BufferImpl,o_pValues,uStack_18._4_4_);
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool Read( std::vector< T > & o_rValues ) const
  {
    o_rValues.clear();
    ViconCGStreamType::UInt32 Size = 0;
    if( !m_BufferImpl.ReadPod( Size ) )
    {
      return false;
    }
    o_rValues.resize( Size );
    return VBufferDetail< VIsPod< T >::Answer >::Read( m_BufferImpl, o_rValues.empty() ? 0 : &o_rValues[ 0 ], Size );
  }